

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

BigInt * multiplicative_inverse(BigInt *__return_storage_ptr__,BigInt *e,BigInt *phi)

{
  bool bVar1;
  BigInt BStack_a8;
  BigInt x;
  BigInt g;
  BigInt y;
  
  x.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x.sign = 1;
  y.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  y.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  y.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  y.sign = x.sign;
  extended_gcd(&g,e,phi,&x,&y);
  BigInt::BigInt(&BStack_a8,1);
  bVar1 = BigInt::operator!=(&g,&BStack_a8);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&BStack_a8);
  if (bVar1) {
    BigInt::BigInt(__return_storage_ptr__,0);
  }
  else {
    BigInt::operator+(&BStack_a8,&x,phi);
    BigInt::operator%(__return_storage_ptr__,&BStack_a8,phi);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&BStack_a8);
  }
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&g);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&y);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&x);
  return __return_storage_ptr__;
}

Assistant:

BigInt multiplicative_inverse(const BigInt &e, const BigInt &phi) {
    BigInt x, y;
    BigInt g = extended_gcd(e, phi, x, y);
    if (g != BigInt(1))
        return BigInt(0);
    //throw invalid_argument("phi and public key pair have no multiplicative inverse");

    return (x + phi) % phi; //! for optimization and negatives
}